

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::cpp::CppGenerator::GenCreateParam_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  SymbolTable<flatbuffers::Value> *this_00;
  Value *type_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Presence PVar4;
  StructDef *pSVar5;
  _Alloc_hider *p_Var6;
  CppGenerator *this_01;
  BaseType BVar7;
  int iVar8;
  const_iterator cVar9;
  undefined8 *puVar10;
  long *plVar11;
  undefined8 *puVar12;
  size_type *psVar13;
  long *plVar14;
  char *pcVar15;
  _Rb_tree_header *p_Var16;
  long lVar17;
  char *pcVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  bool bVar21;
  string underlying_type;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enum_value;
  string value;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [24];
  uint16_t uStack_150;
  undefined6 uStack_14e;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  CppGenerator *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  SymbolTable<flatbuffers::Value> *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"_o->","");
  local_108 = this;
  if ((field->value).type.base_type == BASE_TYPE_UTYPE) {
    Name_abi_cxx11_(&local_1a8,this,field);
    std::__cxx11::string::substr((ulong)local_168,(ulong)&local_1a8);
    std::__cxx11::string::_M_append((char *)&local_100,local_168._0_8_);
    if ((_Alloc_hider *)local_168._0_8_ != (_Alloc_hider *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::string::append((char *)&local_100);
  }
  else {
    Name_abi_cxx11_((string *)local_168,this,field);
    std::__cxx11::string::_M_append((char *)&local_100,local_168._0_8_);
    if ((_Alloc_hider *)local_168._0_8_ != (_Alloc_hider *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    }
  }
  type_00 = &field->value;
  BVar7 = (type_00->type).base_type;
  if ((BVar7 != BASE_TYPE_VECTOR) && (BVar7 != BASE_TYPE_VECTOR64)) {
    local_168._0_8_ = (_Alloc_hider *)(local_168 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"cpp_type","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)&(field->super_Definition).attributes,(key_type *)local_168);
    if ((_Rb_tree_header *)cVar9._M_node ==
        &(field->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
      bVar21 = true;
    }
    else {
      bVar21 = *(long *)(cVar9._M_node + 2) == 0;
    }
    if ((_Alloc_hider *)local_168._0_8_ != (_Alloc_hider *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    }
    if (!bVar21) {
      GenTypeBasic_abi_cxx11_((string *)local_168,local_108,&type_00->type,false);
      std::operator+(&local_e0,"_rehasher ? static_cast<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168)
      ;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      puVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_128.field_2._M_allocated_capacity = *puVar12;
        local_128.field_2._8_8_ = puVar10[3];
      }
      else {
        local_128.field_2._M_allocated_capacity = *puVar12;
        local_128._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_128._M_string_length = puVar10[1];
      *puVar10 = puVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_128,(ulong)local_100._M_dataplus._M_p);
      puVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_148.field_2._M_allocated_capacity = *puVar12;
        local_148.field_2._8_8_ = puVar10[3];
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar12;
        local_148._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_148._M_string_length = puVar10[1];
      *puVar10 = puVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      GenPtrGet_abi_cxx11_(&local_c0,local_108,field);
      uVar19 = (EnumDef *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        uVar19 = local_148.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < (EnumDef *)(local_c0._M_string_length + local_148._M_string_length)) {
        uVar19 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          uVar19 = local_c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < (EnumDef *)(local_c0._M_string_length + local_148._M_string_length))
        goto LAB_00199d99;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_c0,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
      }
      else {
LAB_00199d99:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_148,(ulong)local_c0._M_dataplus._M_p);
      }
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      puVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_188.field_2._M_allocated_capacity = *puVar12;
        local_188.field_2._8_8_ = puVar10[3];
      }
      else {
        local_188.field_2._M_allocated_capacity = *puVar12;
        local_188._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_188._M_string_length = puVar10[1];
      *puVar10 = puVar12;
      puVar10[1] = 0;
      *(undefined1 *)puVar12 = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
      puVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_1a8.field_2._M_allocated_capacity = *puVar12;
        local_1a8.field_2._8_8_ = puVar10[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar12;
        local_1a8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_1a8._M_string_length = puVar10[1];
      *puVar10 = puVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_100,(string *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,
                        (ulong)(local_188.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        (ulong)(local_c0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        (ulong)(local_148.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        (ulong)(local_128.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((_Alloc_hider *)local_168._0_8_ != (_Alloc_hider *)(local_168 + 0x10)) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
      }
    }
    BVar7 = (type_00->type).base_type;
  }
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(BVar7) {
  case BASE_TYPE_STRING:
    if (field->shared == false) {
      pcVar18 = "";
      if (field->offset64 != false) {
        pcVar18 = "<::flatbuffers::Offset64>";
      }
      pcVar15 = pcVar18 + 0x19;
      if (field->offset64 == false) {
        pcVar15 = pcVar18;
      }
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,pcVar18,pcVar15);
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,0x3627cc);
      puVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_1a8.field_2._M_allocated_capacity = *puVar12;
        local_1a8.field_2._8_8_ = puVar10[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar12;
        local_1a8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_1a8._M_string_length = puVar10[1];
      *puVar10 = puVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
      puVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_168._16_8_ = *puVar12;
        _uStack_150 = puVar10[3];
        local_168._0_8_ = (_Alloc_hider *)(local_168 + 0x10);
      }
      else {
        local_168._16_8_ = *puVar12;
        local_168._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar10;
      }
      local_168._8_8_ = puVar10[1];
      *puVar10 = puVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_168._0_8_);
      if ((_Alloc_hider *)local_168._0_8_ != (_Alloc_hider *)(local_168 + 0x10)) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,
                        (ulong)(local_188.field_2._M_allocated_capacity + 1));
      }
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_100._M_dataplus._M_p);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    if (field->presence == kRequired) goto LAB_0019c706;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,local_100._M_dataplus._M_p,
               local_100._M_dataplus._M_p + local_100._M_string_length);
    std::__cxx11::string::append((char *)&local_148);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
    puVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_188.field_2._M_allocated_capacity = *puVar12;
      local_188.field_2._8_8_ = puVar10[3];
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    }
    else {
      local_188.field_2._M_allocated_capacity = *puVar12;
      local_188._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_188._M_string_length = puVar10[1];
    *puVar10 = puVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
    puVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_1a8.field_2._M_allocated_capacity = *puVar12;
      local_1a8.field_2._8_8_ = puVar10[3];
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *puVar12;
      local_1a8._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_1a8._M_string_length = puVar10[1];
    *puVar10 = puVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_1a8,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
    puVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_168._16_8_ = *puVar12;
      _uStack_150 = puVar10[3];
      local_168._0_8_ = (_Alloc_hider *)(local_168 + 0x10);
    }
    else {
      local_168._16_8_ = *puVar12;
      local_168._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar10;
    }
    local_168._8_8_ = puVar10[1];
    *puVar10 = puVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_168);
    if ((_Alloc_hider *)local_168._0_8_ != (_Alloc_hider *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,
                      (ulong)(local_188.field_2._M_allocated_capacity + 1));
    }
    uVar19 = local_148.field_2._M_allocated_capacity;
    _Var20._M_p = local_148._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == &local_148.field_2) goto LAB_0019c706;
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_VECTOR64:
    local_168._0_4_ = (field->value).type.element;
    pSVar5 = (field->value).type.struct_def;
    local_168._16_8_ = (field->value).type.enum_def;
    local_168._4_4_ = 0;
    uStack_150 = (field->value).type.fixed_length;
    local_168._8_8_ = pSVar5;
    if ((int)local_168._0_4_ < 0xd) {
      if (local_168._0_4_ == BASE_TYPE_UTYPE) {
        std::__cxx11::string::substr((ulong)&local_1a8,(ulong)&local_100);
        std::__cxx11::string::operator=((string *)&local_100,(string *)&local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        this_01 = local_108;
        GenTypeBasic_abi_cxx11_(&local_1a8,local_108,(Type *)local_168,false);
        if ((this_01->opts_).super_IDLOptions.scoped_enums == true) {
          EscapeKeyword(&local_188,this_01,(string *)(field->value).type.enum_def);
        }
        else {
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_188,local_1a8._M_dataplus._M_p,
                     local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
        }
        std::operator+(&local_128,"__va->_",&local_100);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        puVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_148.field_2._M_allocated_capacity = *puVar12;
          local_148.field_2._8_8_ = puVar10[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar12;
          local_148._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_148._M_string_length = puVar10[1];
        *puVar10 = puVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        paVar1 = &local_128.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar1) {
          operator_delete(local_128._M_dataplus._M_p,
                          (ulong)(local_128.field_2._M_allocated_capacity + 1));
        }
        if ((local_108->opts_).super_IDLOptions.scoped_enums == false) {
          std::operator+(&local_a0,"static_cast<",&local_1a8);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_a0);
          plVar14 = plVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar14) {
            local_c0.field_2._M_allocated_capacity = *plVar14;
            local_c0.field_2._8_8_ = plVar11[3];
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          }
          else {
            local_c0.field_2._M_allocated_capacity = *plVar14;
            local_c0._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_c0._M_string_length = plVar11[1];
          *plVar11 = (long)plVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_c0,(ulong)local_148._M_dataplus._M_p);
          psVar13 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_e0.field_2._M_allocated_capacity = *psVar13;
            local_e0.field_2._8_8_ = plVar11[3];
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar13;
            local_e0._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_e0._M_string_length = plVar11[1];
          *plVar11 = (long)psVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
          puVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_128.field_2._M_allocated_capacity = *puVar12;
            local_128.field_2._8_8_ = puVar10[3];
            local_128._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_128.field_2._M_allocated_capacity = *puVar12;
            local_128._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_128._M_string_length = puVar10[1];
          *puVar10 = puVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_148,(string *)&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,
                            (ulong)(local_128.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,
                            (ulong)(local_c0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
        }
        std::operator+(&local_50,"_fbb.CreateVector<",&local_188);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar14 = plVar11 + 2;
        if ((long *)*plVar11 == plVar14) {
          local_60 = *plVar14;
          lStack_58 = plVar11[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar14;
          local_70 = (long *)*plVar11;
        }
        local_68 = plVar11[1];
        *plVar11 = (long)plVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_70,(ulong)local_100._M_dataplus._M_p);
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_a0.field_2._M_allocated_capacity = *psVar13;
          local_a0.field_2._8_8_ = plVar11[3];
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar13;
          local_a0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_a0._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_a0);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        plVar14 = plVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar14) {
          local_c0.field_2._M_allocated_capacity = *plVar14;
          local_c0.field_2._8_8_ = plVar11[3];
        }
        else {
          local_c0.field_2._M_allocated_capacity = *plVar14;
          local_c0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_c0._M_string_length = plVar11[1];
        *plVar11 = (long)plVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_c0,(ulong)local_148._M_dataplus._M_p);
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_e0.field_2._M_allocated_capacity = *psVar13;
          local_e0.field_2._8_8_ = plVar11[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar13;
          local_e0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_e0._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
        puVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_128.field_2._M_allocated_capacity = *puVar12;
          local_128.field_2._8_8_ = puVar10[3];
          local_128._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_128.field_2._M_allocated_capacity = *puVar12;
          local_128._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_128._M_string_length = puVar10[1];
        *puVar10 = puVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_128._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar1) {
          operator_delete(local_128._M_dataplus._M_p,
                          (ulong)(local_128.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,
                          (ulong)(local_c0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        uVar19 = local_1a8.field_2._M_allocated_capacity;
        _Var20._M_p = local_1a8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_0019c52a;
      }
      else if (local_168._0_4_ == BASE_TYPE_BOOL) {
        std::operator+(&local_188,"_fbb.CreateVector(",&local_100);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        puVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_1a8.field_2._M_allocated_capacity = *puVar12;
          local_1a8.field_2._8_8_ = puVar10[3];
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *puVar12;
          local_1a8._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_1a8._M_string_length = puVar10[1];
        *puVar10 = puVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
LAB_0019c4f9:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        uVar19 = local_188.field_2._M_allocated_capacity;
        _Var20._M_p = local_188._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p == &local_188.field_2) goto LAB_0019c52a;
      }
      else {
LAB_0019a41e:
        if ((((EnumDef *)local_168._16_8_ != (EnumDef *)0x0) &&
            ((9 < local_168._0_4_ - BASE_TYPE_UTYPE ||
             ((local_108->opts_).super_IDLOptions.scoped_enums == false)))) &&
           ((*(int *)&(local_108->opts_).super_IDLOptions.field_0x30c < 2 ||
            ((9 < local_168._0_4_ - BASE_TYPE_UTYPE ||
             ((local_108->opts_).g_only_fixed_enums == false)))))) {
          GenTypeBasic_abi_cxx11_
                    (&local_1a8,local_108,&((EnumDef *)local_168._16_8_)->underlying_type,false);
          std::operator+(&local_a0,"_fbb.CreateVectorScalarCast<",&local_1a8);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_a0);
          plVar14 = plVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar14) {
            local_c0.field_2._M_allocated_capacity = *plVar14;
            local_c0.field_2._8_8_ = plVar11[3];
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          }
          else {
            local_c0.field_2._M_allocated_capacity = *plVar14;
            local_c0._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_c0._M_string_length = plVar11[1];
          *plVar11 = (long)plVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::operator+(&local_e0,&local_c0,&local_100);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
          puVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_128.field_2._M_allocated_capacity = *puVar12;
            local_128.field_2._8_8_ = puVar10[3];
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          }
          else {
            local_128.field_2._M_allocated_capacity = *puVar12;
            local_128._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_128._M_string_length = puVar10[1];
          *puVar10 = puVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::operator+(&local_148,&local_128,&local_100);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
          puVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_188.field_2._M_allocated_capacity = *puVar12;
            local_188.field_2._8_8_ = puVar10[3];
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          }
          else {
            local_188.field_2._M_allocated_capacity = *puVar12;
            local_188._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_188._M_string_length = puVar10[1];
          *puVar10 = puVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_188._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,
                            (ulong)(local_128.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,
                            (ulong)(local_c0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          uVar19 = local_1a8.field_2._M_allocated_capacity;
          _Var20._M_p = local_1a8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) goto LAB_0019c522;
          goto LAB_0019c52a;
        }
        paVar1 = &local_1a8.field_2;
        local_1a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"cpp_type","");
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                        *)&(field->super_Definition).attributes,&local_1a8);
        if ((_Rb_tree_header *)cVar9._M_node ==
            &(field->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
          bVar21 = true;
        }
        else {
          bVar21 = *(long *)(cVar9._M_node + 2) == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        if (bVar21) {
          if ((type_00->type).base_type == BASE_TYPE_VECTOR64) {
            std::operator+(&local_188,"_fbb.CreateVector64(",&local_100);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
            puVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_1a8.field_2._M_allocated_capacity = *puVar12;
              local_1a8.field_2._8_8_ = puVar10[3];
              local_1a8._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *puVar12;
              local_1a8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1a8._M_string_length = puVar10[1];
            *puVar10 = puVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
          }
          else {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            if (field->offset64 == true) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            std::operator+(&local_188,"(",&local_100);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
            puVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_1a8.field_2._M_allocated_capacity = *puVar12;
              local_1a8.field_2._8_8_ = puVar10[3];
              local_1a8._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *puVar12;
              local_1a8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1a8._M_string_length = puVar10[1];
            *puVar10 = puVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
          }
          goto LAB_0019c4f9;
        }
        GenTypeBasic_abi_cxx11_(&local_1a8,local_108,(Type *)local_168,false);
        std::operator+(&local_e0,"_fbb.CreateVector<",&local_1a8);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_e0);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_128.field_2._M_allocated_capacity = *psVar13;
          local_128.field_2._8_8_ = plVar11[3];
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar13;
          local_128._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_128._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_128,(ulong)local_100._M_dataplus._M_p);
        paVar2 = &local_148.field_2;
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_148.field_2._M_allocated_capacity = *psVar13;
          local_148.field_2._8_8_ = plVar11[3];
          local_148._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar13;
          local_148._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_148._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_148);
        paVar3 = &local_188.field_2;
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_188.field_2._M_allocated_capacity = *psVar13;
          local_188.field_2._8_8_ = plVar11[3];
          local_188._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_188.field_2._M_allocated_capacity = *psVar13;
          local_188._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_188._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_188._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar3) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::operator+(&local_148,"static_cast<",&local_1a8);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_148);
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_188.field_2._M_allocated_capacity = *psVar13;
          local_188.field_2._8_8_ = plVar11[3];
          local_188._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_188.field_2._M_allocated_capacity = *psVar13;
          local_188._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_188._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_188._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar3) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_e0,"(__va->_",&local_100);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        puVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_128.field_2._M_allocated_capacity = *puVar12;
          local_128.field_2._8_8_ = puVar10[3];
        }
        else {
          local_128.field_2._M_allocated_capacity = *puVar12;
          local_128._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_128._M_string_length = puVar10[1];
        *puVar10 = puVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        GenPtrGet_abi_cxx11_(&local_c0,local_108,field);
        uVar19 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          uVar19 = local_128.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < (EnumDef *)(local_c0._M_string_length + local_128._M_string_length)) {
          uVar19 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            uVar19 = local_c0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < (EnumDef *)(local_c0._M_string_length + local_128._M_string_length))
          goto LAB_0019bc2c;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_c0,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
        }
        else {
LAB_0019bc2c:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_128,(ulong)local_c0._M_dataplus._M_p);
        }
        puVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_148.field_2._M_allocated_capacity = *puVar12;
          local_148.field_2._8_8_ = puVar10[3];
          local_148._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar12;
          local_148._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_148._M_string_length = puVar10[1];
        *puVar10 = puVar12;
        puVar10[1] = 0;
        *(undefined1 *)puVar12 = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        puVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_188.field_2._M_allocated_capacity = *puVar12;
          local_188.field_2._8_8_ = puVar10[3];
          local_188._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_188.field_2._M_allocated_capacity = *puVar12;
          local_188._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_188._M_string_length = puVar10[1];
        *puVar10 = puVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_188._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar3) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,
                          (ulong)(local_c0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,
                          (ulong)(local_128.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar19 = local_1a8.field_2._M_allocated_capacity;
        _Var20._M_p = local_1a8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p == paVar1) goto LAB_0019c52a;
      }
LAB_0019c522:
      operator_delete(_Var20._M_p,
                      (ulong)((long)&(((EnumDef *)uVar19)->super_Definition).name._M_dataplus._M_p +
                             1));
    }
    else {
      if (local_168._0_4_ == BASE_TYPE_STRING) {
        NativeString_abi_cxx11_(&local_1a8,local_108,field);
        iVar8 = std::__cxx11::string::compare((char *)&local_1a8);
        paVar1 = &local_1a8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        if (iVar8 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::operator+(&local_188,"(",&local_100);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_188);
          psVar13 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_1a8.field_2._M_allocated_capacity = *psVar13;
            local_1a8.field_2._8_8_ = plVar11[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar13;
            local_1a8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1a8._M_string_length = plVar11[1];
          *plVar11 = (long)psVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::operator+(&local_188,"return __va->__fbb->CreateString(__va->_",&local_100);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_188);
          plVar14 = plVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar14) {
            local_1a8.field_2._M_allocated_capacity = *plVar14;
            local_1a8.field_2._8_8_ = plVar11[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *plVar14;
            local_1a8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1a8._M_string_length = plVar11[1];
          *plVar11 = (long)plVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
          goto LAB_0019c263;
        }
        std::operator+(&local_188,"_fbb.CreateVectorOfStrings(",&local_100);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
        puVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_1a8.field_2._M_allocated_capacity = *puVar12;
          local_1a8.field_2._8_8_ = puVar10[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *puVar12;
          local_1a8._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_1a8._M_string_length = puVar10[1];
        *puVar10 = puVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
        goto LAB_0019c4f9;
      }
      if (local_168._0_4_ == BASE_TYPE_STRUCT) {
        if (pSVar5->fixed == true) {
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"native_type","");
          local_78 = &(pSVar5->super_Definition).attributes;
          cVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                          *)local_78,&local_1a8);
          p_Var16 = &(pSVar5->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar9._M_node == p_Var16) {
            lVar17 = 0;
          }
          else {
            lVar17 = *(long *)(cVar9._M_node + 2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          if (lVar17 == 0) {
            if (((type_00->type).base_type == BASE_TYPE_VECTOR64) ||
               (std::__cxx11::string::append((char *)__return_storage_ptr__),
               field->offset64 == true)) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            std::operator+(&local_188,"(",&local_100);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            puVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_1a8.field_2._M_allocated_capacity = *puVar12;
              local_1a8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *puVar12;
              local_1a8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1a8._M_string_length = puVar10[1];
            *puVar10 = puVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
            goto LAB_0019c4f9;
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar19 = local_168._8_8_;
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
          BaseGenerator::WrapInNameSpace
                    (&local_128,&local_108->super_BaseGenerator,(Definition *)uVar19,&local_e0);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
          puVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_148.field_2._M_allocated_capacity = *puVar12;
            local_148.field_2._8_8_ = puVar10[3];
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          }
          else {
            local_148.field_2._M_allocated_capacity = *puVar12;
            local_148._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_148._M_string_length = puVar10[1];
          *puVar10 = puVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::operator+(&local_188,&local_148,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar17 + 0x20));
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          plVar14 = plVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar14) {
            local_1a8.field_2._M_allocated_capacity = *plVar14;
            local_1a8.field_2._8_8_ = plVar11[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *plVar14;
            local_1a8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1a8._M_string_length = plVar11[1];
          *plVar11 = (long)plVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,
                            (ulong)(local_128.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_1a8,"(",&local_100);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1a8,"native_type_pack_name","");
          cVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                          *)local_78,&local_1a8);
          if ((_Rb_tree_header *)cVar9._M_node == p_Var16) {
            lVar17 = 0;
          }
          else {
            lVar17 = *(long *)(cVar9._M_node + 2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          if (lVar17 != 0) {
            std::operator+(&local_1a8,", ::flatbuffers::Pack",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (lVar17 + 0x20));
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,
                              (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
            }
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar19 = local_168._8_8_;
          paVar1 = &local_148.field_2;
          local_148._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"");
          BaseGenerator::WrapInNameSpace
                    (&local_188,&local_108->super_BaseGenerator,(Definition *)uVar19,&local_148);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_188);
          paVar2 = &local_1a8.field_2;
          psVar13 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_1a8.field_2._M_allocated_capacity = *psVar13;
            local_1a8.field_2._8_8_ = plVar11[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar13;
            local_1a8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1a8._M_string_length = plVar11[1];
          *plVar11 = (long)psVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          paVar3 = &local_188.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar3) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar1) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          std::operator+(&local_188,"(",&local_100);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_188);
          plVar14 = plVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar14) {
            local_1a8.field_2._M_allocated_capacity = *plVar14;
            local_1a8.field_2._8_8_ = plVar11[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *plVar14;
            local_1a8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1a8._M_string_length = plVar11[1];
          *plVar11 = (long)plVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar3) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::operator+(&local_1a8,"return Create",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168._8_8_);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          if (field->native_inline == true) {
            std::operator+(&local_188,"&(__va->_",&local_100);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_188);
            plVar14 = plVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar14) {
              local_1a8.field_2._M_allocated_capacity = *plVar14;
              local_1a8.field_2._8_8_ = plVar11[3];
              local_1a8._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *plVar14;
              local_1a8._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_1a8._M_string_length = plVar11[1];
            *plVar11 = (long)plVar14;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_1a8._M_dataplus._M_p,
                              (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
            }
            uVar19 = local_188.field_2._M_allocated_capacity;
            _Var20._M_p = local_188._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != paVar3) {
LAB_0019c254:
              operator_delete(_Var20._M_p,
                              (ulong)((long)&(((EnumDef *)uVar19)->super_Definition).name.
                                             _M_dataplus._M_p + 1));
            }
          }
          else {
            std::operator+(&local_148,"__va->_",&local_100);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
            puVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_188.field_2._M_allocated_capacity = *puVar12;
              local_188.field_2._8_8_ = puVar10[3];
              local_188._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_188.field_2._M_allocated_capacity = *puVar12;
              local_188._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_188._M_string_length = puVar10[1];
            *puVar10 = puVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            GenPtrGet_abi_cxx11_(&local_128,local_108,field);
            std::operator+(&local_1a8,&local_188,&local_128);
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_1a8._M_dataplus._M_p,
                              (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,
                              (ulong)(local_128.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != paVar3) {
              operator_delete(local_188._M_dataplus._M_p,
                              (ulong)(local_188.field_2._M_allocated_capacity + 1));
            }
            uVar19 = local_148.field_2._M_allocated_capacity;
            _Var20._M_p = local_148._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) goto LAB_0019c254;
          }
LAB_0019c263:
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      else {
        if (local_168._0_4_ != BASE_TYPE_UNION) goto LAB_0019a41e;
        std::operator+(&local_128,"_fbb.CreateVector<::flatbuffers::Offset<void>>(",&local_100);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
        puVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_148.field_2._M_allocated_capacity = *puVar12;
          local_148.field_2._8_8_ = puVar10[3];
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar12;
          local_148._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_148._M_string_length = puVar10[1];
        *puVar10 = puVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_148,(ulong)local_100._M_dataplus._M_p);
        puVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_188.field_2._M_allocated_capacity = *puVar12;
          local_188.field_2._8_8_ = puVar10[3];
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        }
        else {
          local_188.field_2._M_allocated_capacity = *puVar12;
          local_188._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_188._M_string_length = puVar10[1];
        *puVar10 = puVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
        puVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_1a8.field_2._M_allocated_capacity = *puVar12;
          local_1a8.field_2._8_8_ = puVar10[3];
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *puVar12;
          local_1a8._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_1a8._M_string_length = puVar10[1];
        *puVar10 = puVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        uVar19 = local_128.field_2._M_allocated_capacity;
        _Var20._M_p = local_128._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) goto LAB_0019c522;
      }
    }
LAB_0019c52a:
    paVar1 = &local_1a8.field_2;
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"nested_flatbuffer","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)&(field->super_Definition).attributes,&local_1a8);
    if (((_Rb_tree_header *)cVar9._M_node ==
         &(field->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) ||
       (*(long *)(cVar9._M_node + 2) == 0)) {
      if ((local_108->opts_).super_IDLOptions.set_empty_vectors_to_null != true) {
        uVar19 = local_1a8.field_2._M_allocated_capacity;
        _Var20._M_p = local_1a8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p == paVar1) goto LAB_0019c706;
        break;
      }
      PVar4 = field->presence;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if (PVar4 == kRequired) goto LAB_0019c706;
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,local_100._M_dataplus._M_p,
               local_100._M_dataplus._M_p + local_100._M_string_length);
    std::__cxx11::string::append((char *)&local_148);
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_148,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
    puVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_188.field_2._M_allocated_capacity = *puVar12;
      local_188.field_2._8_8_ = puVar10[3];
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    }
    else {
      local_188.field_2._M_allocated_capacity = *puVar12;
      local_188._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_188._M_string_length = puVar10[1];
    *puVar10 = puVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
    puVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_1a8.field_2._M_allocated_capacity = *puVar12;
      local_1a8.field_2._8_8_ = puVar10[3];
      local_1a8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *puVar12;
      local_1a8._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_1a8._M_string_length = puVar10[1];
    *puVar10 = puVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,
                      (ulong)(local_188.field_2._M_allocated_capacity + 1));
    }
    uVar19 = local_148.field_2._M_allocated_capacity;
    _Var20._M_p = local_148._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == &local_148.field_2) goto LAB_0019c706;
    break;
  case BASE_TYPE_STRUCT:
    pSVar5 = (field->value).type.struct_def;
    if (pSVar5->fixed != true) {
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,local_100._M_dataplus._M_p,
                 local_100._M_dataplus._M_p + local_100._M_string_length);
      std::__cxx11::string::append((char *)&local_1a8);
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_1a8,
                           (ulong)(pSVar5->super_Definition).name._M_dataplus._M_p);
      p_Var6 = (_Alloc_hider *)(local_168 + 0x10);
      puVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_168._16_8_ = *puVar12;
        _uStack_150 = puVar10[3];
        local_168._0_8_ = p_Var6;
      }
      else {
        local_168._16_8_ = *puVar12;
        local_168._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar10;
      }
      local_168._8_8_ = puVar10[1];
      *puVar10 = puVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_168._0_8_);
      if ((_Alloc_hider *)local_168._0_8_ != p_Var6) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     "(_fbb, ",&local_100);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_168._0_8_);
      if ((_Alloc_hider *)local_168._0_8_ != p_Var6) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
      }
      if (field->native_inline == false) {
        GenPtrGet_abi_cxx11_((string *)local_168,local_108,field);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_168._0_8_);
        if ((_Alloc_hider *)local_168._0_8_ != p_Var6) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_0019c706;
    }
    p_Var6 = (_Alloc_hider *)(local_168 + 0x10);
    local_168._0_8_ = p_Var6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"native_type","");
    this_00 = &(pSVar5->super_Definition).attributes;
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)this_00,(key_type *)local_168);
    p_Var16 = &(pSVar5->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar9._M_node == p_Var16) {
      bVar21 = true;
    }
    else {
      bVar21 = *(long *)(cVar9._M_node + 2) == 0;
    }
    if ((_Alloc_hider *)local_168._0_8_ != p_Var6) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    }
    if (bVar21) {
      if (field->native_inline == true) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,"&",&local_100);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_168._0_8_);
        uVar19 = local_168._16_8_;
        _Var20._M_p = (pointer)local_168._0_8_;
        if ((_Alloc_hider *)local_168._0_8_ == (_Alloc_hider *)(local_168 + 0x10))
        goto LAB_0019c706;
      }
      else {
        std::operator+(&local_148,&local_100," ? ");
        std::operator+(&local_188,&local_148,&local_100);
        GenPtrGet_abi_cxx11_(&local_128,local_108,field);
        std::operator+(&local_1a8,&local_188,&local_128);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
        puVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_168._16_8_ = *puVar12;
          _uStack_150 = puVar10[3];
          local_168._0_8_ = (_Alloc_hider *)(local_168 + 0x10);
        }
        else {
          local_168._16_8_ = *puVar12;
          local_168._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar10;
        }
        local_168._8_8_ = puVar10[1];
        *puVar10 = puVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_168._0_8_);
        if ((_Alloc_hider *)local_168._0_8_ != (_Alloc_hider *)(local_168 + 0x10)) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,
                          (ulong)(local_128.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        uVar19 = local_148.field_2._M_allocated_capacity;
        _Var20._M_p = local_148._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p == &local_148.field_2) goto LAB_0019c706;
      }
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_168._0_8_ = p_Var6;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,"native_type_pack_name","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      *)this_00,(key_type *)local_168);
      if ((_Rb_tree_header *)cVar9._M_node == p_Var16) {
        lVar17 = 0;
      }
      else {
        lVar17 = *(long *)(cVar9._M_node + 2);
      }
      if ((_Alloc_hider *)local_168._0_8_ != p_Var6) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
      }
      if (lVar17 != 0) {
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(lVar17 + 0x20));
      }
      std::operator+(&local_1a8,"(",&local_100);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
      puVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_168._16_8_ = *puVar12;
        _uStack_150 = puVar10[3];
        local_168._0_8_ = p_Var6;
      }
      else {
        local_168._16_8_ = *puVar12;
        local_168._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar10;
      }
      local_168._8_8_ = puVar10[1];
      *puVar10 = puVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_168._0_8_);
      if ((_Alloc_hider *)local_168._0_8_ != p_Var6) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
      }
      uVar19 = local_1a8.field_2._M_allocated_capacity;
      _Var20._M_p = local_1a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_0019c706;
    }
    break;
  case BASE_TYPE_UNION:
    local_168._0_8_ = (_Alloc_hider *)(local_168 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_168,local_100._M_dataplus._M_p,
               local_100._M_dataplus._M_p + local_100._M_string_length);
    std::__cxx11::string::append((char *)local_168);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_168._0_8_);
    uVar19 = local_168._16_8_;
    _Var20._M_p = (pointer)local_168._0_8_;
    if ((_Alloc_hider *)local_168._0_8_ == (_Alloc_hider *)(local_168 + 0x10)) goto LAB_0019c706;
    break;
  default:
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_100._M_dataplus._M_p);
    goto LAB_0019c706;
  }
  operator_delete(_Var20._M_p,
                  (ulong)((long)&(((EnumDef *)uVar19)->super_Definition).name._M_dataplus._M_p + 1))
  ;
LAB_0019c706:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenCreateParam(const FieldDef &field) {
    std::string value = "_o->";
    if (field.value.type.base_type == BASE_TYPE_UTYPE) {
      value += StripUnionType(Name(field));
      value += ".type";
    } else {
      value += Name(field);
    }
    if (!IsVector(field.value.type) && field.attributes.Lookup("cpp_type")) {
      auto type = GenTypeBasic(field.value.type, false);
      value =
          "_rehasher ? "
          "static_cast<" +
          type + ">((*_rehasher)(" + value + GenPtrGet(field) + ")) : 0";
    }

    std::string code;
    switch (field.value.type.base_type) {
      // String fields are of the form:
      //   _fbb.CreateString(_o->field)
      // or
      //   _fbb.CreateSharedString(_o->field)
      case BASE_TYPE_STRING: {
        if (!field.shared) {
          code +=
              "_fbb.CreateString" +
              std::string(field.offset64 ? "<::flatbuffers::Offset64>" : "") +
              "(";
        } else {
          code += "_fbb.CreateSharedString(";
        }
        code += value;
        code.push_back(')');

        // For optional fields, check to see if there actually is any data
        // in _o->field before attempting to access it. If there isn't,
        // depending on set_empty_strings_to_null either set it to 0 or an empty
        // string.
        if (!field.IsRequired()) {
          auto empty_value = opts_.set_empty_strings_to_null
                                 ? "0"
                                 : "_fbb.CreateSharedString(\"\")";
          code = value + ".empty() ? " + empty_value + " : " + code;
        }
        break;
      }
        // Vector fields come in several flavours, of the forms:
        //   _fbb.CreateVector(_o->field);
        //   _fbb.CreateVector((const utype*)_o->field.data(),
        //   _o->field.size()); _fbb.CreateVectorOfStrings(_o->field)
        //   _fbb.CreateVectorOfStructs(_o->field)
        //   _fbb.CreateVector<Offset<T>>(_o->field.size() [&](size_t i) {
        //     return CreateT(_fbb, _o->Get(i), rehasher);
        //   });
      case BASE_TYPE_VECTOR64:
      case BASE_TYPE_VECTOR: {
        auto vector_type = field.value.type.VectorType();
        switch (vector_type.base_type) {
          case BASE_TYPE_STRING: {
            if (NativeString(&field) == "std::string") {
              code += "_fbb.CreateVectorOfStrings(" + value + ")";
            } else {
              // Use by-function serialization to emulate
              // CreateVectorOfStrings(); this works also with non-std strings.
              code +=
                  "_fbb.CreateVector<::flatbuffers::Offset<::flatbuffers::"
                  "String>>"
                  " ";
              code += "(" + value + ".size(), ";
              code += "[](size_t i, _VectorArgs *__va) { ";
              code +=
                  "return __va->__fbb->CreateString(__va->_" + value + "[i]);";
              code += " }, &_va )";
            }
            break;
          }
          case BASE_TYPE_STRUCT: {
            if (IsStruct(vector_type)) {
              const auto &struct_attrs =
                  field.value.type.struct_def->attributes;
              const auto native_type = struct_attrs.Lookup("native_type");
              if (native_type) {
                code += "_fbb.CreateVectorOfNativeStructs<";
                code += WrapInNameSpace(*vector_type.struct_def) + ", " +
                        native_type->constant + ">";
                code += "(" + value;
                const auto pack_name =
                    struct_attrs.Lookup("native_type_pack_name");
                if (pack_name) {
                  code += ", ::flatbuffers::Pack" + pack_name->constant;
                }
                code += ")";
              } else {
                // If the field uses 64-bit addressing, create a 64-bit vector.
                if (field.value.type.base_type == BASE_TYPE_VECTOR64) {
                  code += "_fbb.CreateVectorOfStructs64";
                } else {
                  code += "_fbb.CreateVectorOfStructs";
                  if (field.offset64) {
                    // This is normal 32-bit vector, with 64-bit addressing.
                    code += "64<::flatbuffers::Vector>";
                  }
                }
                code += "(" + value + ")";
              }
            } else {
              code += "_fbb.CreateVector<::flatbuffers::Offset<";
              code += WrapInNameSpace(*vector_type.struct_def) + ">> ";
              code += "(" + value + ".size(), ";
              code += "[](size_t i, _VectorArgs *__va) { ";
              code += "return Create" + vector_type.struct_def->name;
              code += "(*__va->__fbb, ";
              if (field.native_inline) {
                code += "&(__va->_" + value + "[i])";
              } else {
                code += "__va->_" + value + "[i]" + GenPtrGet(field);
              }
              code += ", __va->__rehasher); }, &_va )";
            }
            break;
          }
          case BASE_TYPE_BOOL: {
            code += "_fbb.CreateVector(" + value + ")";
            break;
          }
          case BASE_TYPE_UNION: {
            code +=
                "_fbb.CreateVector<::flatbuffers::"
                "Offset<void>>(" +
                value +
                ".size(), [](size_t i, _VectorArgs *__va) { "
                "return __va->_" +
                value + "[i].Pack(*__va->__fbb, __va->__rehasher); }, &_va)";
            break;
          }
          case BASE_TYPE_UTYPE: {
            value = StripUnionType(value);
            auto underlying_type = GenTypeBasic(vector_type, false);
            const std::string &type = opts_.scoped_enums
                                          ? Name(*field.value.type.enum_def)
                                          : underlying_type;
            auto enum_value = "__va->_" + value + "[i].type";
            if (!opts_.scoped_enums)
              enum_value =
                  "static_cast<" + underlying_type + ">(" + enum_value + ")";

            code += "_fbb.CreateVector<" + type + ">(" + value +
                    ".size(), [](size_t i, _VectorArgs *__va) { return " +
                    enum_value + "; }, &_va)";
            break;
          }
          default: {
            if (field.value.type.enum_def &&
                !VectorElementUserFacing(vector_type)) {
              // For enumerations, we need to get access to the array data for
              // the underlying storage type (eg. uint8_t).
              const auto basetype = GenTypeBasic(
                  field.value.type.enum_def->underlying_type, false);
              code += "_fbb.CreateVectorScalarCast<" + basetype +
                      ">(::flatbuffers::data(" + value + "), " + value +
                      ".size())";
            } else if (field.attributes.Lookup("cpp_type")) {
              auto type = GenTypeBasic(vector_type, false);
              code += "_fbb.CreateVector<" + type + ">(" + value + ".size(), ";
              code += "[](size_t i, _VectorArgs *__va) { ";
              code += "return __va->__rehasher ? ";
              code += "static_cast<" + type + ">((*__va->__rehasher)";
              code += "(__va->_" + value + "[i]" + GenPtrGet(field) + ")) : 0";
              code += "; }, &_va )";
            } else {
              // If the field uses 64-bit addressing, create a 64-bit vector.
              if (field.value.type.base_type == BASE_TYPE_VECTOR64) {
                code += "_fbb.CreateVector64(" + value + ")";
              } else {
                code += "_fbb.CreateVector";
                if (field.offset64) {
                  // This is normal 32-bit vector, with 64-bit addressing.
                  code += "64<::flatbuffers::Vector>";
                }
                code += "(" + value + ")";
              }
            }
            break;
          }
        }

        // If set_empty_vectors_to_null option is enabled, for optional fields,
        // check to see if there actually is any data in _o->field before
        // attempting to access it.
        if (field.attributes.Lookup("nested_flatbuffer") ||
            (opts_.set_empty_vectors_to_null && !field.IsRequired())) {
          code = value + ".size() ? " + code + " : 0";
        }
        break;
      }
      case BASE_TYPE_UNION: {
        // _o->field.Pack(_fbb);
        code += value + ".Pack(_fbb)";
        break;
      }
      case BASE_TYPE_STRUCT: {
        if (IsStruct(field.value.type)) {
          const auto &struct_attribs = field.value.type.struct_def->attributes;
          const auto native_type = struct_attribs.Lookup("native_type");
          if (native_type) {
            code += "::flatbuffers::Pack";
            const auto pack_name =
                struct_attribs.Lookup("native_type_pack_name");
            if (pack_name) { code += pack_name->constant; }
            code += "(" + value + ")";
          } else if (field.native_inline) {
            code += "&" + value;
          } else {
            code += value + " ? " + value + GenPtrGet(field) + " : nullptr";
          }
        } else {
          // _o->field ? CreateT(_fbb, _o->field.get(), _rehasher);
          const std::string &type = field.value.type.struct_def->name;
          code += value + " ? Create" + type;
          code += "(_fbb, " + value;
          if (!field.native_inline) code += GenPtrGet(field);
          code += ", _rehasher) : 0";
        }
        break;
      }
      default: {
        code += value;
        break;
      }
    }
    return code;
  }